

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall
cmFindBase::cmFindBase(cmFindBase *this,string *findCommandName,cmExecutionStatus *status)

{
  cmExecutionStatus *status_local;
  string *findCommandName_local;
  cmFindBase *this_local;
  
  cmFindCommon::cmFindCommon(&this->super_cmFindCommon,status);
  this->_vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_0155a658;
  std::__cxx11::string::string((string *)&this->FindCommandName,(string *)findCommandName);
  std::__cxx11::string::string((string *)&this->VariableDocumentation);
  this->VariableType = UNINITIALIZED;
  std::__cxx11::string::string((string *)&this->VariableName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Names);
  this->NamesPerDir = false;
  this->NamesPerDirAllowed = false;
  std::__cxx11::string::string((string *)&this->EnvironmentPath);
  this->AlreadyDefined = false;
  this->AlreadyInCacheWithoutMetaInfo = false;
  this->StoreResultInCache = true;
  this->Required = false;
  std::__cxx11::string::string((string *)&this->ValidatorName);
  return;
}

Assistant:

cmFindBase::cmFindBase(std::string findCommandName, cmExecutionStatus& status)
  : cmFindCommon(status)
  , FindCommandName(std::move(findCommandName))
{
}